

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O2

int kvtree_util_get_bytecount(kvtree *hash,char *key,unsigned_long *val)

{
  char *__nptr;
  ulong uVar1;
  
  __nptr = kvtree_get_val(hash,key);
  if (__nptr != (char *)0x0) {
    uVar1 = strtoul(__nptr,(char **)0x0,0);
    *val = uVar1;
  }
  return (uint)(__nptr == (char *)0x0);
}

Assistant:

int kvtree_util_get_bytecount(const kvtree* hash, const char* key, unsigned long* val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    *val = strtoul(val_str, NULL, 0);
    rc = KVTREE_SUCCESS;
  }

  return rc;
}